

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int latin1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  undefined1 auVar7 [16];
  
  iVar5 = (int)out;
  iVar3 = (int)in;
  auVar7._0_4_ = -(uint)(out == (uchar *)0x0);
  auVar7._4_4_ = -(uint)(in == (uchar *)0x0);
  auVar7._8_4_ = -(uint)(outlen == (int *)0x0);
  auVar7._12_4_ = -(uint)(inlen == (int *)0x0);
  iVar4 = movmskps((int)vctxt,auVar7);
  if (iVar4 != 0) {
    return -1;
  }
  if (0 < (long)*inlen) {
    pbVar6 = out + *outlen;
    pbVar2 = in + *inlen;
    do {
      bVar1 = *in;
      if ((char)bVar1 < '\0') {
        if ((long)pbVar6 - (long)out < 2) goto LAB_0012d7a4;
        *out = bVar1 >> 6 | 0xc0;
        out[1] = bVar1 & 0xbf;
        out = out + 2;
      }
      else {
        if (pbVar6 <= out) {
LAB_0012d7a4:
          iVar5 = (int)out - iVar5;
          iVar4 = -3;
          goto LAB_0012d7ac;
        }
        *out = bVar1;
        out = out + 1;
      }
      in = in + 1;
    } while (in < pbVar2);
  }
  iVar5 = (int)out - iVar5;
  iVar4 = iVar5;
LAB_0012d7ac:
  *outlen = iVar5;
  *inlen = (int)in - iVar3;
  return iVar4;
}

Assistant:

static int
latin1ToUTF8(unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    unsigned char* outstart = out;
    const unsigned char* instart = in;
    unsigned char* outend;
    const unsigned char* inend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(XML_ENC_ERR_INTERNAL);

    outend = out + *outlen;
    inend = in + *inlen;

    while (in < inend) {
        unsigned c = *in;

	if (c < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = c;
	} else {
            if (outend - out < 2)
                goto done;
	    *out++ = (c >> 6) | 0xC0;
            *out++ = (c & 0x3F) | 0x80;
        }

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}